

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

bool testing::internal::InDeathTestChild(void)

{
  undefined1 in_AL;
  bool bVar1;
  byte bVar2;
  undefined7 in_register_00000001;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  bVar1 = std::operator==(unaff_retaddr,(char *)CONCAT71(in_register_00000001,in_AL));
  bVar2 = g_in_fast_death_test_child;
  if (bVar1) {
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool InDeathTestChild() {
# if GTEST_OS_WINDOWS

  // On Windows, death tests are thread-safe regardless of the value of the
  // death_test_style flag.
  return !GTEST_FLAG(internal_run_death_test).empty();

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe")
    return !GTEST_FLAG(internal_run_death_test).empty();
  else
    return g_in_fast_death_test_child;
#endif
}